

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Rescale(CPpmd8 *p)

{
  UInt16 UVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  CPpmd8_Context *pCVar5;
  Byte *pBVar6;
  bool bVar7;
  byte bVar8;
  Byte BVar9;
  UInt16 UVar10;
  Byte BVar11;
  Byte BVar12;
  UInt16 UVar13;
  undefined4 uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  CPpmd_State *oldPtr;
  void *pvVar18;
  CPpmd_State *pCVar19;
  CPpmd_State *pCVar20;
  undefined4 local_5a;
  CPpmd_State tmp_2;
  uint n1;
  uint n0;
  uint numStats;
  CPpmd_State *pCStack_40;
  CPpmd_State tmp_1;
  CPpmd_State *s1;
  CPpmd_State *pCStack_30;
  CPpmd_State tmp;
  CPpmd_State *s;
  CPpmd_State *stats;
  uint escFreq;
  uint sumFreq;
  uint adder;
  uint i;
  CPpmd8 *p_local;
  
  oldPtr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  pCStack_30 = p->FoundState;
  BVar11 = pCStack_30->Symbol;
  BVar12 = pCStack_30->Freq;
  UVar13 = pCStack_30->SuccessorLow;
  UVar1 = pCStack_30->SuccessorHigh;
  for (; pCStack_30 != oldPtr; pCStack_30 = pCStack_30 + -1) {
    BVar9 = pCStack_30[-1].Freq;
    UVar10 = pCStack_30[-1].SuccessorLow;
    pCStack_30->Symbol = pCStack_30[-1].Symbol;
    pCStack_30->Freq = BVar9;
    pCStack_30->SuccessorLow = UVar10;
    pCStack_30->SuccessorHigh = pCStack_30[-1].SuccessorHigh;
  }
  pCStack_30->Symbol = BVar11;
  pCStack_30->Freq = BVar12;
  pCStack_30->SuccessorLow = UVar13;
  pCStack_30->SuccessorHigh = UVar1;
  stats._0_4_ = (uint)p->MinContext->SummFreq - (uint)pCStack_30->Freq;
  pCStack_30->Freq = pCStack_30->Freq + '\x04';
  uVar16 = (uint)(p->OrderFall != 0);
  pCStack_30->Freq = (Byte)(pCStack_30->Freq + uVar16 >> 1);
  uVar15 = (ushort)pCStack_30->Freq;
  sumFreq = (uint)p->MinContext->NumStats;
  pCVar19 = pCStack_30;
  do {
    pCStack_30 = pCVar19;
    pCVar19 = pCStack_30 + 1;
    stats._0_4_ = (uint)stats - pCStack_30[1].Freq;
    pCStack_30[1].Freq = (Byte)(pCStack_30[1].Freq + uVar16 >> 1);
    uVar15 = pCStack_30[1].Freq + uVar15;
    if (pCStack_30->Freq < pCStack_30[1].Freq) {
      uVar2 = pCVar19->Symbol;
      uVar3 = pCVar19->Freq;
      uVar4 = pCVar19->SuccessorLow;
      UVar1 = pCStack_30[1].SuccessorHigh;
      pCVar20 = pCVar19;
      do {
        pCStack_40 = pCVar20;
        BVar11 = pCStack_40[-1].Freq;
        UVar13 = pCStack_40[-1].SuccessorLow;
        pCStack_40->Symbol = pCStack_40[-1].Symbol;
        pCStack_40->Freq = BVar11;
        pCStack_40->SuccessorLow = UVar13;
        pCStack_40->SuccessorHigh = pCStack_40[-1].SuccessorHigh;
        pCVar20 = pCStack_40 + -1;
        bVar7 = false;
        if (pCVar20 != oldPtr) {
          bVar7 = pCStack_40[-2].Freq < (byte)uVar3;
        }
      } while (bVar7);
      pCVar20->Symbol = uVar2;
      pCVar20->Freq = uVar3;
      pCVar20->SuccessorLow = uVar4;
      pCStack_40[-1].SuccessorHigh = UVar1;
    }
    sumFreq = sumFreq - 1;
  } while (sumFreq != 0);
  if (pCStack_30[1].Freq == '\0') {
    uVar16 = (uint)p->MinContext->NumStats;
    sumFreq = 0;
    pCStack_30 = pCVar19;
    do {
      sumFreq = sumFreq + 1;
      pCVar19 = pCStack_30 + -1;
      pCStack_30 = pCStack_30 + -1;
    } while (pCVar19->Freq == '\0');
    stats._0_4_ = sumFreq + (uint)stats;
    p->MinContext->NumStats = p->MinContext->NumStats - (char)sumFreq;
    if (p->MinContext->NumStats == '\0') {
      uVar17._0_1_ = oldPtr->Symbol;
      uVar17._1_1_ = oldPtr->Freq;
      uVar17._2_2_ = oldPtr->SuccessorLow;
      UVar1 = oldPtr->SuccessorHigh;
      bVar8 = (byte)((((uVar17 >> 8 & 0xff) * 2 + (uint)stats) - 1) / (uint)stats);
      local_5a._0_2_ = CONCAT11(bVar8,(undefined1)uVar17);
      if (0x29 < bVar8) {
        local_5a._0_2_ = CONCAT11(0x29,(undefined1)uVar17);
      }
      local_5a = CONCAT22(uVar17._2_2_,(undefined2)local_5a);
      uVar14 = local_5a;
      InsertNode(p,oldPtr,(uint)p->Units2Indx[(uVar16 + 2 >> 1) - 1]);
      p->MinContext->Flags = (p->MinContext->Flags & 0x10) + (0x3f < (byte)local_5a) * '\b';
      pCVar5 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar5->SummFreq;
      *(undefined4 *)&pCVar5->SummFreq = uVar14;
      *(UInt16 *)((long)&pCVar5->Stats + 2) = UVar1;
      return;
    }
    uVar16 = uVar16 + 2 >> 1;
    uVar17 = (int)(p->MinContext->NumStats + 2) >> 1;
    if (uVar16 != uVar17) {
      pvVar18 = ShrinkUnits(p,oldPtr,uVar16,uVar17);
      p->MinContext->Stats = (int)pvVar18 - (int)p->Base;
    }
    p->MinContext->Flags = p->MinContext->Flags & 0xf7;
    pBVar6 = p->Base;
    uVar16 = p->MinContext->Stats;
    p->MinContext->Flags = p->MinContext->Flags | (0x3f < pBVar6[uVar16]) << 3;
    sumFreq = (uint)p->MinContext->NumStats;
    pCStack_30 = (CPpmd_State *)(pBVar6 + uVar16);
    do {
      p->MinContext->Flags = p->MinContext->Flags | (0x3f < *(byte *)((long)pCStack_30 + 6)) << 3;
      sumFreq = sumFreq - 1;
      pCStack_30 = (CPpmd_State *)((long)pCStack_30 + 6);
    } while (sumFreq != 0);
  }
  p->MinContext->SummFreq = (uVar15 + (short)(uint)stats) - (short)((uint)stats >> 1);
  p->MinContext->Flags = p->MinContext->Flags | 4;
  p->FoundState = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  return;
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}